

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfBoxAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<float>_>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<float>_>_> *this,OStream *os,int version)

{
  float local_1c;
  
  local_1c = (this->_value).min.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).min.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).max.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).max.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  return;
}

Assistant:

void
Box2fAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.min.x);
    Xdr::write <StreamIO> (os, _value.min.y);
    Xdr::write <StreamIO> (os, _value.max.x);
    Xdr::write <StreamIO> (os, _value.max.y);
}